

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O3

Torsion * __thiscall OpenMD::SelectionManager::beginSelectedTorsion(SelectionManager *this,int *i)

{
  pointer pOVar1;
  int iVar2;
  
  pOVar1 = (this->ss_).bitsets_.
           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((**(byte **)&pOVar1[3].bitset_.super__Bvector_base<std::allocator<bool>_> & 1) == 0) {
    iVar2 = OpenMDBitSet::nextOnBit(pOVar1 + 3,0);
    *i = iVar2;
    if (iVar2 == -1) {
      return (Torsion *)0x0;
    }
  }
  else {
    *i = 0;
    iVar2 = 0;
  }
  return (this->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
         ._M_impl.super__Vector_impl_data._M_start[iVar2];
}

Assistant:

Torsion* SelectionManager::beginSelectedTorsion(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[TORSION].size())) {
      if (ss_.bitsets_[TORSION][i]) {
        // check that this processor owns this torsion
        if (torsions_[i] != NULL) return torsions_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[TORSION].firstOnBit();
    return i == -1 ? NULL : torsions_[i];
#endif
  }